

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclareFixture.hpp
# Opt level: O2

int __thiscall
ut11::detail::DeclareFixtureObj<AssertThatTests>::operator()<>
          (DeclareFixtureObj<AssertThatTests> *this,Category *category)

{
  tuple<AssertThatTests_*,_std::default_delete<AssertThatTests>_> this_00;
  __uniq_ptr_impl<AssertThatTests,_std::default_delete<AssertThatTests>_> local_b0;
  shared_ptr<ut11::detail::TestFixtureAbstract> local_a8;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00.super__Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>.
  super__Head_base<0UL,_AssertThatTests_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>)
       operator_new(0xf8);
  memset((void *)this_00.
                 super__Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>.
                 super__Head_base<0UL,_AssertThatTests_*,_false>._M_head_impl,0,0xf8);
  AssertThatTests::AssertThatTests
            ((AssertThatTests *)
             this_00.
             super__Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>.
             super__Head_base<0UL,_AssertThatTests_*,_false>._M_head_impl);
  local_b0._M_t.super__Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>.
  super__Head_base<0UL,_AssertThatTests_*,_false>._M_head_impl =
       (tuple<AssertThatTests_*,_std::default_delete<AssertThatTests>_>)
       (tuple<AssertThatTests_*,_std::default_delete<AssertThatTests>_>)
       this_00.super__Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>.
       super__Head_base<0UL,_AssertThatTests_*,_false>._M_head_impl;
  std::operator+(&local_58,&this->m_name,"(");
  GetString_abi_cxx11_();
  std::operator+(&local_38,&local_58,&local_78);
  std::__cxx11::string::_M_assign
            ((string *)
             ((long)this_00.
                    super__Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>
                    .super__Head_base<0UL,_AssertThatTests_*,_false>._M_head_impl + 8));
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string(local_98,(string *)category);
  (**(code **)(*(long *)this_00.
                        super__Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>
                        .super__Head_base<0UL,_AssertThatTests_*,_false>._M_head_impl + 0x10))
            (this_00.
             super__Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>.
             super__Head_base<0UL,_AssertThatTests_*,_false>._M_head_impl,local_98);
  std::__cxx11::string::~string(local_98);
  std::__shared_ptr<ut11::detail::TestFixtureAbstract,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<AssertThatTests,std::default_delete<AssertThatTests>,void>
            ((__shared_ptr<ut11::detail::TestFixtureAbstract,(__gnu_cxx::_Lock_policy)2> *)&local_a8
             ,(unique_ptr<AssertThatTests,_std::default_delete<AssertThatTests>_> *)&local_b0);
  PushFixture(&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.
              super___shared_ptr<ut11::detail::TestFixtureAbstract,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if ((_Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>)
      local_b0._M_t.super__Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>
      .super__Head_base<0UL,_AssertThatTests_*,_false>._M_head_impl != (AssertThatTests *)0x0) {
    (**(code **)(*(long *)local_b0._M_t.
                          super__Tuple_impl<0UL,_AssertThatTests_*,_std::default_delete<AssertThatTests>_>
                          .super__Head_base<0UL,_AssertThatTests_*,_false>._M_head_impl + 8))();
  }
  return 0;
}

Assistant:

int operator()(Category category, ARGS && ... args)
			{
				std::unique_ptr<T> fixture(new T(std::forward<ARGS>(args)...));
				fixture->SetName(m_name + "(" + GetString(args...));
				fixture->AddCategory(category);

				PushFixture(std::move(fixture));
				return 0;
			}